

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.h
# Opt level: O0

void __thiscall datarate_test::anon_unknown_0::DatarateTest::EndPassHook(DatarateTest *this)

{
  int i;
  DatarateTest *this_local;
  
  this->duration_ = (double)(this->last_pts_ + 1) * this->timebase_;
  this->effective_datarate_ = ((double)this->bits_total_ / 1000.0) / this->duration_;
  if (0 < this->frame_update_bitrate_) {
    for (i = 0; i < 3; i = i + 1) {
      this->effective_datarate_dynamic_[i] =
           (((double)this->bits_total_dynamic_[i] / 1000.0) * 30.0) /
           (double)this->frame_number_dynamic_[i];
    }
  }
  return;
}

Assistant:

void EndPassHook() override {
    duration_ = (last_pts_ + 1) * timebase_;
    // Effective file datarate:
    effective_datarate_ = (bits_total_ / 1000.0) / duration_;
    if (frame_update_bitrate_ > 0) {
      for (int i = 0; i < 3; i++)
        effective_datarate_dynamic_[i] =
            30 * (bits_total_dynamic_[i] / 1000.0) / frame_number_dynamic_[i];
    }
  }